

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_sub_create_info<VkPipelineRasterizationStateCreateInfo>
          (Impl *this,VkPipelineRasterizationStateCreateInfo **sub_info,ScratchAllocator *alloc,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  bool bVar1;
  VkPipelineRasterizationStateCreateInfo *pVVar2;
  bool bVar3;
  void *pNext;
  
  bVar3 = true;
  if (*sub_info != (VkPipelineRasterizationStateCreateInfo *)0x0) {
    pVVar2 = copy<VkPipelineRasterizationStateCreateInfo>(this,*sub_info,1,alloc);
    *sub_info = pVVar2;
    pNext = (void *)0x0;
    bVar1 = copy_pnext_chain(this,pVVar2->pNext,alloc,&pNext,dynamic_state_info,state_flags);
    if (bVar1) {
      (*sub_info)->pNext = pNext;
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool StateRecorder::Impl::copy_sub_create_info(const SubCreateInfo *&sub_info, ScratchAllocator &alloc,
                                               const DynamicStateInfo *dynamic_state_info,
                                               VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	if (sub_info)
	{
		sub_info = copy(sub_info, 1, alloc);
		const void *pNext = nullptr;
		if (!copy_pnext_chain(sub_info->pNext, alloc, &pNext, dynamic_state_info, state_flags))
			return false;
		const_cast<SubCreateInfo *>(sub_info)->pNext = pNext;
	}

	return true;
}